

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLDConfigLDConfigTool.cxx
# Opt level: O0

bool __thiscall
cmLDConfigLDConfigTool::GetLDConfigPaths
          (cmLDConfigLDConfigTool *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  cmRuntimeDependencyArchive *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined8 this_00;
  bool bVar2;
  int iVar3;
  cmMakefile *this_01;
  string *psVar4;
  ulong uVar5;
  cmUVProcessChainBuilder *this_02;
  container_type *arguments;
  Status *pSVar6;
  uv_loop_t *loop;
  istream *piVar7;
  char *string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6d0;
  allocator<char> local_669;
  string local_668;
  allocator<char> local_641;
  string local_640;
  string local_620;
  undefined1 local_600 [8];
  RegularExpressionMatch match;
  cmUVPipeIStream output;
  string line;
  string local_230;
  undefined1 local_210 [8];
  cmUVProcessChain process;
  cmUVProcessChainBuilder builder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  iterator local_180;
  size_type local_178;
  undefined1 local_170 [8];
  cmList ldConfigCommand;
  string local_150;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_12d;
  undefined1 local_12c;
  allocator<char> local_12b;
  allocator<char> local_12a;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100 [32];
  string local_e0 [32];
  iterator local_c0;
  size_type local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  string local_98;
  allocator<char> local_61;
  string local_60;
  string local_40 [8];
  string ldConfigPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paths_local;
  cmLDConfigLDConfigTool *this_local;
  
  ldConfigPath.field_2._8_8_ = paths;
  this_01 = cmRuntimeDependencyArchive::GetMakefile((this->super_cmLDConfigTool).Archive);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CMAKE_LDCONFIG_COMMAND",&local_61);
  psVar4 = cmMakefile::GetSafeDefinition(this_01,&local_60);
  std::__cxx11::string::string(local_40,(string *)psVar4);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    local_12c = 1;
    local_128 = &local_120;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"/sbin",&local_129);
    local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_100,"/usr/sbin",&local_12a);
    local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_e0,"/usr/local/sbin",&local_12b);
    local_12c = 0;
    local_c0 = &local_120;
    local_b8 = 3;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_12d);
    __l._M_len = local_b8;
    __l._M_array = local_c0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_b0,__l,&local_12d);
    cmsys::SystemTools::FindProgram(&local_98,"ldconfig",&local_b0,false);
    std::__cxx11::string::operator=(local_40,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b0);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_12d);
    local_6d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0;
    do {
      local_6d0 = local_6d0 + -1;
      std::__cxx11::string::~string((string *)local_6d0);
    } while (local_6d0 != &local_120);
    std::allocator<char>::~allocator(&local_12b);
    std::allocator<char>::~allocator(&local_12a);
    std::allocator<char>::~allocator(&local_129);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      pcVar1 = (this->super_cmLDConfigTool).Archive;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"Could not find ldconfig",
                 (allocator<char> *)
                 ((long)&ldConfigCommand.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      cmRuntimeDependencyArchive::SetError(pcVar1,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&ldConfigCommand.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      this_local._7_1_ = false;
      ldConfigCommand.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      goto LAB_00b839c2;
    }
  }
  std::__cxx11::string::string((string *)&local_1a0,local_40);
  local_180 = &local_1a0;
  local_178 = 1;
  init._M_len = 1;
  init._M_array = local_180;
  cmList::cmList((cmList *)local_170,init);
  local_720 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_180;
  do {
    local_720 = local_720 + -1;
    std::__cxx11::string::~string((string *)local_720);
  } while (local_720 != &local_1a0);
  cmList::emplace_back<char_const(&)[3]>((cmList *)local_170,(char (*) [3])"-v");
  cmList::emplace_back<char_const(&)[3]>((cmList *)local_170,(char (*) [3])"-N");
  cmList::emplace_back<char_const(&)[3]>((cmList *)local_170,(char (*) [3])"-X");
  cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)&process);
  this_02 = cmUVProcessChainBuilder::SetBuiltinStream
                      ((cmUVProcessChainBuilder *)&process,Stream_OUTPUT);
  arguments = cmList::operator_cast_to_vector_((cmList *)local_170);
  cmUVProcessChainBuilder::AddCommand(this_02,arguments);
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_210);
  bVar2 = cmUVProcessChain::Valid((cmUVProcessChain *)local_210);
  if ((bVar2) &&
     (pSVar6 = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_210,0),
     pSVar6->SpawnResult == 0)) {
    std::__cxx11::string::string((string *)&output.field_0x198);
    if ((GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::
         regex == '\0') &&
       (iVar3 = __cxa_guard_acquire(&GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::regex), iVar3 != 0)) {
      cmsys::RegularExpression::RegularExpression(&GetLDConfigPaths::regex,"^([^\t:]*):");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetLDConfigPaths::regex,
                   &__dso_handle);
      __cxa_guard_release(&GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                           ::regex);
    }
    loop = cmUVProcessChain::GetLoop((cmUVProcessChain *)local_210);
    iVar3 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_210);
    cmBasicUVPipeIStream<char,_std::char_traits<char>_>::cmBasicUVPipeIStream
              ((cmBasicUVPipeIStream<char,_std::char_traits<char>_> *)&match.searchstring,loop,iVar3
              );
    while( true ) {
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&match.searchstring,(string *)&output.field_0x198);
      bVar2 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&piVar7->_vptr_basic_istream +
                                (long)piVar7->_vptr_basic_istream[-3]));
      if (!bVar2) break;
      cmsys::RegularExpressionMatch::RegularExpressionMatch((RegularExpressionMatch *)local_600);
      string = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::RegularExpression::find
                        (&GetLDConfigPaths::regex,string,(RegularExpressionMatch *)local_600);
      this_00 = ldConfigPath.field_2._8_8_;
      if (bVar2) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  (&local_620,(RegularExpressionMatch *)local_600,1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00,&local_620);
        std::__cxx11::string::~string((string *)&local_620);
      }
    }
    bVar2 = cmUVProcessChain::Wait((cmUVProcessChain *)local_210,0);
    if (bVar2) {
      pSVar6 = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_210,0);
      if (pSVar6->ExitStatus == 0) {
        this_local._7_1_ = true;
      }
      else {
        pcVar1 = (this->super_cmLDConfigTool).Archive;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_668,"Failed to run ldconfig",&local_669);
        cmRuntimeDependencyArchive::SetError(pcVar1,&local_668);
        std::__cxx11::string::~string((string *)&local_668);
        std::allocator<char>::~allocator(&local_669);
        this_local._7_1_ = false;
      }
    }
    else {
      pcVar1 = (this->super_cmLDConfigTool).Archive;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_640,"Failed to wait on ldconfig process",&local_641);
      cmRuntimeDependencyArchive::SetError(pcVar1,&local_640);
      std::__cxx11::string::~string((string *)&local_640);
      std::allocator<char>::~allocator(&local_641);
      this_local._7_1_ = false;
    }
    ldConfigCommand.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    cmBasicUVPipeIStream<char,_std::char_traits<char>_>::~cmBasicUVPipeIStream
              ((cmBasicUVPipeIStream<char,_std::char_traits<char>_> *)&match.searchstring);
    std::__cxx11::string::~string((string *)&output.field_0x198);
  }
  else {
    pcVar1 = (this->super_cmLDConfigTool).Archive;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"Failed to start ldconfig process",
               (allocator<char> *)(line.field_2._M_local_buf + 0xf));
    cmRuntimeDependencyArchive::SetError(pcVar1,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)(line.field_2._M_local_buf + 0xf));
    this_local._7_1_ = false;
    ldConfigCommand.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_210);
  cmUVProcessChainBuilder::~cmUVProcessChainBuilder((cmUVProcessChainBuilder *)&process);
  cmList::~cmList((cmList *)local_170);
LAB_00b839c2:
  std::__cxx11::string::~string(local_40);
  return this_local._7_1_;
}

Assistant:

bool cmLDConfigLDConfigTool::GetLDConfigPaths(std::vector<std::string>& paths)
{
  std::string ldConfigPath =
    this->Archive->GetMakefile()->GetSafeDefinition("CMAKE_LDCONFIG_COMMAND");
  if (ldConfigPath.empty()) {
    ldConfigPath = cmSystemTools::FindProgram(
      "ldconfig", { "/sbin", "/usr/sbin", "/usr/local/sbin" });
    if (ldConfigPath.empty()) {
      this->Archive->SetError("Could not find ldconfig");
      return false;
    }
  }

  cmList ldConfigCommand{ ldConfigPath };
  ldConfigCommand.emplace_back("-v");
  ldConfigCommand.emplace_back("-N"); // Don't rebuild the cache.
  ldConfigCommand.emplace_back("-X"); // Don't update links.

  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .AddCommand(ldConfigCommand);
  auto process = builder.Start();
  if (!process.Valid() || process.GetStatus(0).SpawnResult != 0) {
    this->Archive->SetError("Failed to start ldconfig process");
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression regex("^([^\t:]*):");
  cmUVPipeIStream output(process.GetLoop(), process.OutputStream());
  while (std::getline(output, line)) {
    cmsys::RegularExpressionMatch match;
    if (regex.find(line.c_str(), match)) {
      paths.push_back(match.match(1));
    }
  }

  if (!process.Wait()) {
    this->Archive->SetError("Failed to wait on ldconfig process");
    return false;
  }
  if (process.GetStatus(0).ExitStatus != 0) {
    this->Archive->SetError("Failed to run ldconfig");
    return false;
  }

  return true;
}